

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FSingleLumpFont::LoadFON2(FSingleLumpFont *this,int lump,BYTE *data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  size_t __n;
  undefined1 auVar5 [16];
  int iVar6;
  CharData *pCVar7;
  void *pvVar8;
  FFontChar2 *this_00;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ushort *puVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  int local_50;
  int local_38;
  
  this->FontType = FONT2;
  (this->super_FFont).FontHeight = (uint)*(ushort *)(data + 4);
  bVar1 = data[6];
  (this->super_FFont).FirstChar = (uint)bVar1;
  bVar2 = data[7];
  (this->super_FFont).LastChar = (uint)bVar2;
  bVar3 = data[10];
  (this->super_FFont).ActiveColors = (int)((ulong)bVar3 + 1);
  (this->super_FFont).PatchRemap = (BYTE *)0x0;
  this->RescalePalette = data[9] == '\0';
  lVar11 = (ulong)bVar2 - (ulong)bVar1;
  uVar13 = (lVar11 + 1) * 0x10;
  iVar9 = (int)lVar11;
  if (iVar9 < -1) {
    uVar13 = 0xffffffffffffffff;
  }
  uVar17 = lVar11 * 4 + 4;
  if (iVar9 < -1) {
    uVar17 = 0xffffffffffffffff;
  }
  pCVar7 = (CharData *)operator_new__(uVar13);
  (this->super_FFont).Chars = pCVar7;
  pvVar8 = operator_new__(uVar17);
  if ((data[0xb] & 1) == 0) {
    puVar14 = (ushort *)(data + 0xc);
    iVar6 = 0;
  }
  else {
    iVar6 = (int)*(short *)(data + 0xc);
    puVar14 = (ushort *)(data + 0xe);
  }
  (this->super_FFont).GlobalKerning = iVar6;
  auVar5 = _DAT_005d6240;
  uVar16 = (uint)bVar1;
  local_50 = (int)(lVar11 + 1);
  if (data[8] == '\0') {
    if (iVar9 < 0) {
      iVar6 = 0;
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)(((uint)bVar2 - (uint)bVar1) + 1);
      uVar17 = 0;
      iVar6 = 0;
      do {
        uVar4 = puVar14[uVar17];
        *(uint *)((long)pvVar8 + uVar17 * 4) = (uint)uVar4;
        iVar6 = iVar6 + (uint)uVar4;
        uVar17 = uVar17 + 1;
      } while (uVar13 != uVar17);
    }
    puVar14 = puVar14 + uVar13;
  }
  else {
    uVar4 = *puVar14;
    uVar10 = (uint)uVar4;
    if (-1 < iVar9) {
      uVar13 = (ulong)((bVar2 - uVar16) + 1);
      lVar11 = uVar13 - 1;
      auVar18._8_4_ = (int)lVar11;
      auVar18._0_8_ = lVar11;
      auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar17 = 0;
      auVar18 = auVar18 ^ _DAT_005d6240;
      auVar19 = _DAT_005d6f70;
      auVar20 = _DAT_005d6230;
      do {
        auVar21 = auVar20 ^ auVar5;
        iVar6 = auVar18._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar6 && auVar18._0_4_ < auVar21._0_4_ ||
                    iVar6 < auVar21._4_4_) & 1)) {
          *(uint *)((long)pvVar8 + uVar17 * 4) = uVar10;
        }
        if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
            auVar21._12_4_ <= auVar18._12_4_) {
          *(uint *)((long)pvVar8 + uVar17 * 4 + 4) = uVar10;
        }
        auVar21 = auVar19 ^ auVar5;
        iVar22 = auVar21._4_4_;
        if (iVar22 <= iVar6 && (iVar22 != iVar6 || auVar21._0_4_ <= auVar18._0_4_)) {
          *(uint *)((long)pvVar8 + uVar17 * 4 + 8) = (uint)uVar4;
          *(uint *)((long)pvVar8 + uVar17 * 4 + 0xc) = (uint)uVar4;
        }
        uVar17 = uVar17 + 4;
        lVar11 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar11 + 4;
        lVar11 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 4;
        auVar19._8_8_ = lVar11 + 4;
      } while ((uVar13 + 3 & 0xfffffffffffffffc) != uVar17);
    }
    iVar6 = uVar10 * local_50;
    puVar14 = puVar14 + 1;
  }
  if (bVar2 < 0x20 || 0x20 < bVar1) {
    if (bVar2 < 0x4e || 0x4e < bVar1) {
      iVar6 = (iVar6 * 2) / (local_50 * 3);
    }
    else {
      iVar6 = *(int *)((long)pvVar8 + (ulong)(0x4e - uVar16) * 4);
      iVar6 = (iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1;
    }
  }
  else {
    iVar6 = *(int *)((long)pvVar8 + (ulong)(0x20 - uVar16) * 4);
  }
  (this->super_FFont).SpaceWidth = iVar6;
  __n = ((ulong)bVar3 + 1) * 3;
  memcpy(this->PaletteData,puVar14,__n);
  if (-1 < iVar9) {
    pcVar15 = (char *)((long)puVar14 + __n);
    uVar16 = 0;
    do {
      lVar11 = (long)(int)uVar16;
      iVar6 = *(int *)((long)pvVar8 + lVar11 * 4);
      iVar22 = (this->super_FFont).FontHeight;
      iVar12 = iVar22 * iVar6;
      pCVar7 = (this->super_FFont).Chars;
      pCVar7[lVar11].XMove = iVar6;
      if (iVar12 < 1) {
        pCVar7[lVar11].Pic = (FTexture *)0x0;
      }
      else {
        this_00 = (FFontChar2 *)operator_new(0x78);
        local_38 = (int)data;
        FFontChar2::FFontChar2(this_00,lump,(int)pcVar15 - local_38,iVar6,iVar22,0,0);
        (this->super_FFont).Chars[lVar11].Pic = (FTexture *)this_00;
        do {
          uVar10 = (uint)*pcVar15;
          if (*pcVar15 < '\0') {
            iVar12 = iVar12 + uVar10 + -1;
          }
          else {
            pcVar15 = pcVar15 + uVar10;
            iVar12 = iVar12 + ~uVar10;
          }
          pcVar15 = pcVar15 + 2;
        } while (0 < iVar12);
      }
      uVar10 = uVar16;
      if (iVar12 < 0) {
        uVar10 = uVar16 + (this->super_FFont).FirstChar;
        I_FatalError("Overflow decompressing char %d (%c) of %s",(ulong)uVar10,(ulong)uVar10,
                     (this->super_FFont).Name);
      }
      uVar16 = uVar10 + 1;
    } while ((int)uVar10 < iVar9);
  }
  (*(this->super_FFont)._vptr_FFont[4])();
  operator_delete__(pvVar8);
  return;
}

Assistant:

void FSingleLumpFont::LoadFON2 (int lump, const BYTE *data)
{
	int count, i, totalwidth;
	int *widths2;
	WORD *widths;
	const BYTE *palette;
	const BYTE *data_p;

	FontType = FONT2;
	FontHeight = data[4] + data[5]*256;
	FirstChar = data[6];
	LastChar = data[7];
	ActiveColors = data[10]+1;
	PatchRemap = NULL;
	RescalePalette = data[9] == 0;
	
	count = LastChar - FirstChar + 1;
	Chars = new CharData[count];
	widths2 = new int[count];
	if (data[11] & 1)
	{ // Font specifies a kerning value.
		GlobalKerning = LittleShort(*(SWORD *)&data[12]);
		widths = (WORD *)(data + 14);
	}
	else
	{ // Font does not specify a kerning value.
		GlobalKerning = 0;
		widths = (WORD *)(data + 12);
	}
	totalwidth = 0;

	if (data[8])
	{ // Font is mono-spaced.
		totalwidth = LittleShort(widths[0]);
		for (i = 0; i < count; ++i)
		{
			widths2[i] = totalwidth;
		}
		totalwidth *= count;
		palette = (BYTE *)&widths[1];
	}
	else
	{ // Font has varying character widths.
		for (i = 0; i < count; ++i)
		{
			widths2[i] = LittleShort(widths[i]);
			totalwidth += widths2[i];
		}
		palette = (BYTE *)(widths + i);
	}

	if (FirstChar <= ' ' && LastChar >= ' ')
	{
		SpaceWidth = widths2[' '-FirstChar];
	}
	else if (FirstChar <= 'N' && LastChar >= 'N')
	{
		SpaceWidth = (widths2['N' - FirstChar] + 1) / 2;
	}
	else
	{
		SpaceWidth = totalwidth * 2 / (3 * count);
	}

	memcpy(PaletteData, palette, ActiveColors*3);

	data_p = palette + ActiveColors*3;

	for (i = 0; i < count; ++i)
	{
		int destSize = widths2[i] * FontHeight;
		Chars[i].XMove = widths2[i];
		if (destSize <= 0)
		{
			Chars[i].Pic = NULL;
		}
		else
		{
			Chars[i].Pic = new FFontChar2 (lump, int(data_p - data), widths2[i], FontHeight);
			do
			{
				SBYTE code = *data_p++;
				if (code >= 0)
				{
					data_p += code+1;
					destSize -= code+1;
				}
				else if (code != -128)
				{
					data_p++;
					destSize -= (-code)+1;
				}
			} while (destSize > 0);
		}
		if (destSize < 0)
		{
			i += FirstChar;
			I_FatalError ("Overflow decompressing char %d (%c) of %s", i, i, Name);
		}
	}

	LoadTranslations();
	delete[] widths2;
}